

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacReporters.cpp
# Opt level: O1

bool __thiscall
ApprovalTests::Mac::MacDiffReporter::report(MacDiffReporter *this,string *received,string *approved)

{
  pointer pcVar1;
  bool bVar2;
  string local_60;
  string local_40;
  
  bVar2 = SystemUtils::isMacOs();
  if (bVar2) {
    pcVar1 = (received->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + received->_M_string_length);
    pcVar1 = (approved->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + approved->_M_string_length);
    bVar2 = FirstWorkingReporter::report(&this->super_FirstWorkingReporter,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MacDiffReporter::report(std::string received, std::string approved) const
        {
            if (!SystemUtils::isMacOs())
            {
                return false;
            }
            return FirstWorkingReporter::report(received, approved);
        }